

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall t_go_generator::generate_service_server(t_go_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  undefined4 extraout_var;
  t_service *ptVar3;
  undefined4 extraout_var_00;
  ulong uVar4;
  ostream *poVar5;
  string *psVar6;
  reference pptVar7;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_988;
  t_function **local_980;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8 [8];
  string escapedFuncName_1;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  undefined1 local_5c0 [8];
  string x;
  string local_580;
  string local_560 [8];
  string escapedFuncName;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  allocator local_329;
  string local_328;
  undefined1 local_308 [8];
  string self;
  string pServiceName;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long local_108;
  size_t index;
  undefined1 local_e0 [8];
  string serviceName;
  string local_b8 [8];
  string extends_processor_new;
  undefined1 local_90 [8];
  string extends_processor;
  allocator local_59;
  undefined1 local_58 [8];
  string extends;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_go_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&extends.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,"",(allocator *)(extends_processor_new.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(extends_processor_new.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",(allocator *)(serviceName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(serviceName.field_2._M_local_buf + 0xf));
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  publicize((string *)local_e0,this,(string *)CONCAT44(extraout_var,iVar2),false);
  ptVar3 = t_service::get_extends(tservice);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends(tservice);
    type_name_abi_cxx11_((string *)&index,this,&ptVar3->super_t_type);
    std::__cxx11::string::operator=((string *)local_58,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    local_108 = std::__cxx11::string::rfind((char *)local_58,0x4e5538);
    if (local_108 == -1) {
      publicize(&local_2a8,this,(string *)local_58,false);
      std::operator+(&local_288,&local_2a8,"Processor");
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pServiceName.field_2 + 8),"New",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::__cxx11::string::operator=(local_b8,(string *)(pServiceName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(pServiceName.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::substr((ulong)&local_168,(ulong)local_58);
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)local_58);
      publicize(&local_188,this,&local_1a8,false);
      std::operator+(&local_148,&local_168,&local_188);
      std::operator+(&local_128,&local_148,"Processor");
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::substr((ulong)&local_228,(ulong)local_58);
      std::operator+(&local_208,&local_228,"New");
      std::__cxx11::string::substr((ulong)&local_268,(ulong)local_58);
      publicize(&local_248,this,&local_268,false);
      std::operator+(&local_1e8,&local_208,&local_248);
      std::operator+(&local_1c8,&local_1e8,"Processor");
      std::__cxx11::string::operator=(local_b8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
    }
  }
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  privatize((string *)((long)&self.field_2 + 8),this,(string *)CONCAT44(extraout_var_00,iVar2));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"self",&local_329);
  t_generator::tmp((string *)local_308,&this->super_t_generator,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_848,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_848);
    poVar5 = std::operator<<(poVar5,"type ");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor struct {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_848);
    t_generator::indent_abi_cxx11_(&local_868,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_868);
    poVar5 = std::operator<<(poVar5,"  *");
    poVar5 = std::operator<<(poVar5,(string *)local_90);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_868);
    t_generator::indent_abi_cxx11_(&local_888,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_888);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_888);
    t_generator::indent_abi_cxx11_(&local_8a8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_8a8);
    poVar5 = std::operator<<(poVar5,"func New");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor(handler ");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,") *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_8a8);
    t_generator::indent_abi_cxx11_(&local_8c8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_8c8);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_308);
    poVar5 = std::operator<<(poVar5," := &");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor{");
    poVar5 = std::operator<<(poVar5,local_b8);
    poVar5 = std::operator<<(poVar5,"(handler)}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_8c8);
    extends.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    while( true ) {
      escapedFuncName_1.field_2._8_8_ =
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&extends.field_2 + 8),
                         (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&escapedFuncName_1.field_2 + 8));
      if (!bVar1) break;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&extends.field_2 + 8));
      psVar6 = t_function::get_name_abi_cxx11_(*pptVar7);
      (*(this->super_t_generator)._vptr_t_generator[3])(local_8f8,this,psVar6);
      t_generator::indent_abi_cxx11_(&local_918,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_918);
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)local_308);
      poVar5 = std::operator<<(poVar5,".AddToProcessorMap(\"");
      poVar5 = std::operator<<(poVar5,local_8f8);
      poVar5 = std::operator<<(poVar5,"\", &");
      poVar5 = std::operator<<(poVar5,(string *)(self.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"Processor");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&extends.field_2 + 8));
      psVar6 = t_function::get_name_abi_cxx11_(*pptVar7);
      publicize(&local_938,this,psVar6,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_938);
      poVar5 = std::operator<<(poVar5,"{handler:handler})");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string(local_8f8);
      __gnu_cxx::
      __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
      operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  *)((long)&extends.field_2 + 8));
    }
    t_generator::indent_abi_cxx11_(&local_958,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_958);
    poVar5 = std::operator<<(poVar5,"  return ");
    poVar5 = std::operator<<(poVar5,(string *)local_308);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_958);
    t_generator::indent_abi_cxx11_(&local_978,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_978);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_978);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_350);
    poVar5 = std::operator<<(poVar5,"type ");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor struct {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_350);
    t_generator::indent_abi_cxx11_(&local_370,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_370);
    poVar5 = std::operator<<(poVar5,"  processorMap map[string]thrift.TProcessorFunction");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_370);
    t_generator::indent_abi_cxx11_(&local_390,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_390);
    poVar5 = std::operator<<(poVar5,"  handler ");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_390);
    t_generator::indent_abi_cxx11_(&local_3b0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_3b0);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3b0);
    t_generator::indent_abi_cxx11_(&local_3d0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_3d0);
    poVar5 = std::operator<<(poVar5,"func (p *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,
                             "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3d0);
    t_generator::indent_abi_cxx11_(&local_3f0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_3f0);
    poVar5 = std::operator<<(poVar5,"  p.processorMap[key] = processor");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3f0);
    t_generator::indent_abi_cxx11_(&local_410,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_410);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_410);
    t_generator::indent_abi_cxx11_(&local_430,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_430);
    poVar5 = std::operator<<(poVar5,"func (p *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,
                             "Processor) GetProcessorFunction(key string) (processor thrift.TProcessorFunction, ok bool) {"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_430);
    t_generator::indent_abi_cxx11_(&local_450,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_450);
    poVar5 = std::operator<<(poVar5,"  processor, ok = p.processorMap[key]");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_450);
    t_generator::indent_abi_cxx11_(&local_470,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_470);
    poVar5 = std::operator<<(poVar5,"  return processor, ok");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_470);
    t_generator::indent_abi_cxx11_(&local_490,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_490);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_490);
    t_generator::indent_abi_cxx11_(&local_4b0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_4b0);
    poVar5 = std::operator<<(poVar5,"func (p *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,
                             "Processor) ProcessorMap() map[string]thrift.TProcessorFunction {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4b0);
    t_generator::indent_abi_cxx11_(&local_4d0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_4d0);
    poVar5 = std::operator<<(poVar5,"  return p.processorMap");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4d0);
    t_generator::indent_abi_cxx11_(&local_4f0,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_4f0);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4f0);
    t_generator::indent_abi_cxx11_(&local_510,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_510);
    poVar5 = std::operator<<(poVar5,"func New");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor(handler ");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,") *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,"Processor {");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_510);
    t_generator::indent_abi_cxx11_(&local_530,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_530);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_308);
    poVar5 = std::operator<<(poVar5," := &");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,
                             "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_530);
    extends.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    while( true ) {
      escapedFuncName.field_2._8_8_ =
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&extends.field_2 + 8),
                         (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&escapedFuncName.field_2 + 8));
      if (!bVar1) break;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&extends.field_2 + 8));
      psVar6 = t_function::get_name_abi_cxx11_(*pptVar7);
      (*(this->super_t_generator)._vptr_t_generator[3])(local_560,this,psVar6);
      t_generator::indent_abi_cxx11_(&local_580,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_580);
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)local_308);
      poVar5 = std::operator<<(poVar5,".processorMap[\"");
      poVar5 = std::operator<<(poVar5,local_560);
      poVar5 = std::operator<<(poVar5,"\"] = &");
      poVar5 = std::operator<<(poVar5,(string *)(self.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"Processor");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&extends.field_2 + 8));
      psVar6 = t_function::get_name_abi_cxx11_(*pptVar7);
      publicize((string *)((long)&x.field_2 + 8),this,psVar6,false);
      poVar5 = std::operator<<(poVar5,(string *)(x.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"{handler:handler}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)(x.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string(local_560);
      __gnu_cxx::
      __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
      operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  *)((long)&extends.field_2 + 8));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5e0,"x",&local_5e1);
    t_generator::tmp((string *)local_5c0,&this->super_t_generator,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    t_generator::indent_abi_cxx11_(&local_608,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_608);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = std::operator<<(poVar5,(string *)local_308);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_608);
    t_generator::indent_abi_cxx11_(&local_628,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_628);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_628);
    t_generator::indent_abi_cxx11_(&local_648,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_648);
    poVar5 = std::operator<<(poVar5,"func (p *");
    poVar5 = std::operator<<(poVar5,(string *)local_e0);
    poVar5 = std::operator<<(poVar5,
                             "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err thrift.TException) {"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_648);
    t_generator::indent_abi_cxx11_(&local_668,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_668);
    poVar5 = std::operator<<(poVar5,"  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_668);
    t_generator::indent_abi_cxx11_(&local_688,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_688);
    poVar5 = std::operator<<(poVar5,"  if err2 != nil { return false, thrift.WrapTException(err2) }"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_688);
    t_generator::indent_abi_cxx11_(&local_6a8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_6a8);
    poVar5 = std::operator<<(poVar5,"  if processor, ok := p.GetProcessorFunction(name); ok {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_6a8);
    t_generator::indent_abi_cxx11_(&local_6c8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_6c8);
    poVar5 = std::operator<<(poVar5,"    return processor.Process(ctx, seqId, iprot, oprot)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_6c8);
    t_generator::indent_abi_cxx11_(&local_6e8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_6e8);
    poVar5 = std::operator<<(poVar5,"  }");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_6e8);
    t_generator::indent_abi_cxx11_(&local_708,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_708);
    poVar5 = std::operator<<(poVar5,"  iprot.Skip(ctx, thrift.STRUCT)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_708);
    t_generator::indent_abi_cxx11_(&local_728,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_728);
    poVar5 = std::operator<<(poVar5,"  iprot.ReadMessageEnd(ctx)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_728);
    t_generator::indent_abi_cxx11_(&local_748,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_748);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_5c0);
    poVar5 = std::operator<<(poVar5,
                             " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function \" + name)"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_748);
    t_generator::indent_abi_cxx11_(&local_768,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_768);
    poVar5 = std::operator<<(poVar5,"  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)")
    ;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_768);
    t_generator::indent_abi_cxx11_(&local_788,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_788);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_5c0);
    poVar5 = std::operator<<(poVar5,".Write(ctx, oprot)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_788);
    t_generator::indent_abi_cxx11_(&local_7a8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_7a8);
    poVar5 = std::operator<<(poVar5,"  oprot.WriteMessageEnd(ctx)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_7a8);
    t_generator::indent_abi_cxx11_(&local_7c8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_7c8);
    poVar5 = std::operator<<(poVar5,"  oprot.Flush(ctx)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_7c8);
    t_generator::indent_abi_cxx11_(&local_7e8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_7e8);
    poVar5 = std::operator<<(poVar5,"  return false, ");
    poVar5 = std::operator<<(poVar5,(string *)local_5c0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_7e8);
    t_generator::indent_abi_cxx11_(&local_808,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_808);
    poVar5 = std::operator<<(poVar5,"");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_808);
    t_generator::indent_abi_cxx11_(&local_828,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_828);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)local_5c0);
  }
  local_980 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_980;
  while( true ) {
    local_988._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),&local_988);
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    generate_process_function(this,tservice,*pptVar7);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string((string *)(self.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_go_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  string extends = "";
  string extends_processor = "";
  string extends_processor_new = "";
  string serviceName(publicize(tservice->get_name()));

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_processor = extends.substr(0, index + 1) + publicize(extends.substr(index + 1))
                          + "Processor";
      extends_processor_new = extends.substr(0, index + 1) + "New"
                              + publicize(extends.substr(index + 1)) + "Processor";
    } else {
      extends_processor = publicize(extends) + "Processor";
      extends_processor_new = "New" + extends_processor;
    }
  }

  string pServiceName(privatize(tservice->get_name()));
  // Generate the header portion
  string self(tmp("self"));

  if (extends_processor.empty()) {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  processorMap map[string]thrift.TProcessorFunction" << endl;
    f_types_ << indent() << "  handler " << serviceName << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {"
               << endl;
    f_types_ << indent() << "  p.processorMap[key] = processor" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) GetProcessorFunction(key string) "
                  "(processor thrift.TProcessorFunction, ok bool) {" << endl;
    f_types_ << indent() << "  processor, ok = p.processorMap[key]" << endl;
    f_types_ << indent() << "  return processor, ok" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) ProcessorMap() map[string]thrift.TProcessorFunction {" << endl;
    f_types_ << indent() << "  return p.processorMap" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl << endl;
    f_types_
        << indent() << "  " << self << " := &" << serviceName
        << "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
        << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".processorMap[\"" << escapedFuncName << "\"] = &"
                 << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler}" << endl;
    }

    string x(tmp("x"));
    f_types_ << indent() << "return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err "
                  "thrift.TException) {" << endl;
    f_types_ << indent() << "  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)" << endl;
    f_types_ << indent() << "  if err2 != nil { return false, thrift.WrapTException(err2) }" << endl;
    f_types_ << indent() << "  if processor, ok := p.GetProcessorFunction(name); ok {" << endl;
    f_types_ << indent() << "    return processor.Process(ctx, seqId, iprot, oprot)" << endl;
    f_types_ << indent() << "  }" << endl;
    f_types_ << indent() << "  iprot.Skip(ctx, thrift.STRUCT)" << endl;
    f_types_ << indent() << "  iprot.ReadMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  " << x
               << " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function "
                  "\" + name)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)" << endl;
    f_types_ << indent() << "  " << x << ".Write(ctx, oprot)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  oprot.Flush(ctx)" << endl;
    f_types_ << indent() << "  return false, " << x << endl;
    f_types_ << indent() << "" << endl;
    f_types_ << indent() << "}" << endl << endl;
  } else {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  *" << extends_processor << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl;
    f_types_ << indent() << "  " << self << " := &" << serviceName << "Processor{"
               << extends_processor_new << "(handler)}" << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".AddToProcessorMap(\"" << escapedFuncName
                 << "\", &" << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler})" << endl;
    }

    f_types_ << indent() << "  return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
  }

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  f_types_ << endl;
}